

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2beep.cpp
# Opt level: O0

void beep(int fre,int usDuration)

{
  byte bVar1;
  int r;
  int ff;
  int usDuration_local;
  int fre_local;
  
  if (0 < fre) {
    outb(0xb6,0x43);
    outb((uchar)(0x1234dc / (long)fre),0x42);
    outb((uchar)((ulong)(0x1234dc / (long)fre) >> 8),0x42);
  }
  bVar1 = inb(0x61);
  if (0 < fre) {
    outb(bVar1 | 3,0x61);
  }
  usleep(usDuration);
  outb(bVar1 & 0xfc,0x61);
  return;
}

Assistant:

void beep(int fre, int usDuration)
{
    if (fre > 0) {
        int ff = 1193180/fre;
        outb( 0xB6,            0x43);
        outb( ff & 0xff,       0x42);
        outb((ff >> 8) & 0xff, 0x42);
    }

    int r = inb(0x61);
    if(fre > 0) outb(r|3, 0x61);
    usleep(usDuration);
    outb(r & 0xFC, 0x61);
}